

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

void __thiscall wallet::WalletInit::Construct(WalletInit *this,NodeContext *node)

{
  ArgsManager *this_00;
  bool bVar1;
  ArgsManager **ppAVar2;
  pointer *__ptr;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_> wallet_loader
  ;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  ppAVar2 = inline_assertion_check<true,ArgsManager*&>
                      (&node->args,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/init.cpp"
                       ,0x7f,"Construct","node.args");
  this_00 = *ppAVar2;
  wallet_loader._M_t.
  super___uniq_ptr_impl<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>.
  _M_t.
  super__Tuple_impl<0UL,_interfaces::WalletLoader_*,_std::default_delete<interfaces::WalletLoader>_>
  .super__Head_base<0UL,_interfaces::WalletLoader_*,_false>._M_head_impl =
       (__uniq_ptr_data<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>,_true,_true>
        )(__uniq_ptr_data<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>,_true,_true>
          )&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&wallet_loader,"-disablewallet","");
  bVar1 = ArgsManager::GetBoolArg(this_00,(string *)&wallet_loader,false);
  if (wallet_loader._M_t.
      super___uniq_ptr_impl<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
      ._M_t.
      super__Tuple_impl<0UL,_interfaces::WalletLoader_*,_std::default_delete<interfaces::WalletLoader>_>
      .super__Head_base<0UL,_interfaces::WalletLoader_*,_false>._M_head_impl !=
      (__uniq_ptr_data<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>,_true,_true>
       )&local_38) {
    operator_delete((void *)wallet_loader._M_t.
                            super___uniq_ptr_impl<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_interfaces::WalletLoader_*,_std::default_delete<interfaces::WalletLoader>_>
                            .super__Head_base<0UL,_interfaces::WalletLoader_*,_false>._M_head_impl,
                    local_38._M_allocated_capacity + 1);
  }
  if (bVar1) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/init.cpp"
    ;
    source_file._M_len = 0x5f;
    logging_function._M_str = "Construct";
    logging_function._M_len = 9;
    LogPrintFormatInternal<>
              (logging_function,source_file,0x81,ALL,Info,(ConstevalFormatString<0U>)0xfda182);
  }
  else {
    (**(code **)(*(long *)node->init + 0x28))
              (&wallet_loader,node->init,
               (node->chain)._M_t.
               super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
               _M_t.
               super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
               super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl);
    node->wallet_loader =
         (WalletLoader *)
         wallet_loader._M_t.
         super___uniq_ptr_impl<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
         ._M_t.
         super__Tuple_impl<0UL,_interfaces::WalletLoader_*,_std::default_delete<interfaces::WalletLoader>_>
         .super__Head_base<0UL,_interfaces::WalletLoader_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<interfaces::ChainClient,std::default_delete<interfaces::ChainClient>>,std::allocator<std::unique_ptr<interfaces::ChainClient,std::default_delete<interfaces::ChainClient>>>>
    ::
    emplace_back<std::unique_ptr<interfaces::WalletLoader,std::default_delete<interfaces::WalletLoader>>>
              ((vector<std::unique_ptr<interfaces::ChainClient,std::default_delete<interfaces::ChainClient>>,std::allocator<std::unique_ptr<interfaces::ChainClient,std::default_delete<interfaces::ChainClient>>>>
                *)&node->chain_clients,&wallet_loader);
    if ((__uniq_ptr_impl<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>)
        wallet_loader._M_t.
        super___uniq_ptr_impl<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
        ._M_t.
        super__Tuple_impl<0UL,_interfaces::WalletLoader_*,_std::default_delete<interfaces::WalletLoader>_>
        .super__Head_base<0UL,_interfaces::WalletLoader_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>)
        0x0) {
      (**(code **)(*(long *)wallet_loader._M_t.
                            super___uniq_ptr_impl<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_interfaces::WalletLoader_*,_std::default_delete<interfaces::WalletLoader>_>
                            .super__Head_base<0UL,_interfaces::WalletLoader_*,_false>._M_head_impl +
                  8))();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WalletInit::Construct(NodeContext& node) const
{
    ArgsManager& args = *Assert(node.args);
    if (args.GetBoolArg("-disablewallet", DEFAULT_DISABLE_WALLET)) {
        LogPrintf("Wallet disabled!\n");
        return;
    }
    auto wallet_loader = node.init->makeWalletLoader(*node.chain);
    node.wallet_loader = wallet_loader.get();
    node.chain_clients.emplace_back(std::move(wallet_loader));
}